

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O1

void __thiscall kj::_::anon_unknown_0::MockExceptionCallback::flush(MockExceptionCallback *this)

{
  ssize_t sVar1;
  int *piVar2;
  pointer __buf;
  pointer pcVar3;
  bool bVar4;
  
  if (this->outputPipe != -1) {
    __buf = (this->text)._M_dataplus._M_p;
    pcVar3 = __buf + (this->text)._M_string_length;
    do {
      if (pcVar3 <= __buf) break;
      sVar1 = write(this->outputPipe,__buf,(long)pcVar3 - (long)__buf);
      if (sVar1 < 0) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 != 4;
      }
      else {
        __buf = __buf + sVar1;
        bVar4 = false;
      }
    } while (!bVar4);
    (this->text)._M_string_length = 0;
    *(this->text)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

void flush() {
    if (outputPipe != -1) {
      const char* pos = &*text.begin();
      const char* end = pos + text.size();

      while (pos < end) {
        miniposix::ssize_t n = miniposix::write(outputPipe, pos, end - pos);
        if (n < 0) {
          if (errno == EINTR) {
            continue;
          } else {
            break;  // Give up on error.
          }
        }
        pos += n;
      }

      text.clear();
    }
  }